

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O1

int write_header(archive_write *a,archive_entry *entry)

{
  la_int64_t *plVar1;
  wchar_t wVar2;
  mode_t mVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  archive_string_conv *sc;
  int *piVar7;
  char *pcVar8;
  dev_t dVar9;
  ulong uVar10;
  la_int64_t lVar11;
  time_t v;
  size_t sVar12;
  char *pcVar13;
  int iVar14;
  size_t length;
  int iVar15;
  size_t len;
  char *p;
  char *path;
  char h [110];
  size_t local_c8;
  char *local_c0;
  size_t local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined6 uStack_50;
  undefined2 uStack_4a;
  undefined6 uStack_48;
  undefined8 local_42 [2];
  
  plVar1 = (la_int64_t *)a->format_data;
  sc = get_sconv(a);
  wVar2 = _archive_entry_pathname_l(entry,&local_b0,&local_c8,sc);
  if (wVar2 == L'\0') {
    iVar15 = 0;
LAB_00190b5c:
    local_b8 = local_c8;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    uStack_4a = 0;
    uStack_48 = 0;
    local_42[0] = 0;
    format_hex(0x70701,&local_a8,6);
    dVar9 = archive_entry_devmajor(entry);
    format_hex(dVar9,(void *)((long)&uStack_70 + 6),8);
    dVar9 = archive_entry_devminor(entry);
    format_hex(dVar9,(void *)((long)&local_68 + 6),8);
    uVar10 = archive_entry_ino64(entry);
    if (0xffffffff < (long)uVar10) {
      archive_set_error(&a->archive,0x22,"large inode number truncated");
      iVar15 = -0x14;
    }
    format_hex(uVar10 & 0xffffffff,(void *)((long)&local_a8 + 6),8);
    mVar3 = archive_entry_mode(entry);
    format_hex((ulong)mVar3,(void *)((long)&uStack_a0 + 6),8);
    lVar11 = archive_entry_uid(entry);
    format_hex(lVar11,(void *)((long)&local_98 + 6),8);
    lVar11 = archive_entry_gid(entry);
    format_hex(lVar11,(void *)((long)&uStack_90 + 6),8);
    uVar4 = archive_entry_nlink(entry);
    format_hex((ulong)uVar4,(void *)((long)&local_88 + 6),8);
    mVar3 = archive_entry_filetype(entry);
    if ((mVar3 == 0x6000) || (mVar3 = archive_entry_filetype(entry), mVar3 == 0x2000)) {
      dVar9 = archive_entry_rdevmajor(entry);
      format_hex(dVar9,(void *)((long)&uStack_60 + 6),8);
      dVar9 = archive_entry_rdevminor(entry);
    }
    else {
      dVar9 = 0;
      format_hex(0,(void *)((long)&uStack_60 + 6),8);
    }
    format_hex(dVar9,(void *)((long)&local_58 + 6),8);
    v = archive_entry_mtime(entry);
    format_hex(v,(void *)((long)&uStack_80 + 6),8);
    length = (size_t)((int)local_b8 + 1);
    format_hex(length,&uStack_4a,8);
    format_hex(0,local_42,8);
    mVar3 = archive_entry_filetype(entry);
    if (mVar3 != 0x8000) {
      archive_entry_set_size(entry,0);
    }
    wVar2 = _archive_entry_symlink_l(entry,&local_c0,&local_c8,sc);
    if (wVar2 != L'\0') {
      piVar7 = __errno_location();
      if (*piVar7 == 0xc) {
        pcVar13 = "Can\'t allocate memory for Likname";
        goto LAB_00190d6f;
      }
      pcVar13 = archive_entry_symlink(entry);
      pcVar8 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar13,pcVar8);
      iVar15 = -0x14;
    }
    if ((local_c0 == (char *)0x0 || local_c8 == 0) || (*local_c0 == '\0')) {
      sVar12 = archive_entry_size(entry);
    }
    else {
      sVar12 = strlen(local_c0);
    }
    iVar5 = format_hex(sVar12,(void *)((long)&local_78 + 6),8);
    if (iVar5 == 0) {
      iVar6 = __archive_write_output(a,&local_a8,0x6e);
      iVar14 = -0x1e;
      iVar5 = iVar14;
      if ((iVar6 == 0) && (iVar6 = __archive_write_output(a,local_b0,length), iVar6 == 0)) {
        uVar4 = 1U - (int)local_b8 & 3;
        if ((uVar4 == 0) || (iVar6 = __archive_write_output(a,"",(ulong)uVar4), iVar6 == 0)) {
          lVar11 = archive_entry_size(entry);
          pcVar13 = local_c0;
          *plVar1 = lVar11;
          *(uint *)(plVar1 + 1) = -(int)lVar11 & 3;
          iVar5 = iVar15;
          if ((local_c0 != (char *)0x0) && (*local_c0 != '\0')) {
            sVar12 = strlen(local_c0);
            iVar6 = __archive_write_output(a,pcVar13,sVar12);
            iVar5 = iVar14;
            if (iVar6 == 0) {
              sVar12 = strlen(local_c0);
              iVar6 = __archive_write_output(a,"",(ulong)(-(int)sVar12 & 3));
              iVar5 = -0x1e;
              if (iVar6 == 0) {
                iVar5 = iVar15;
              }
            }
          }
        }
      }
    }
    else {
      archive_set_error(&a->archive,0x22,"File is too large for this format.");
      iVar5 = -0x19;
    }
  }
  else {
    piVar7 = __errno_location();
    if (*piVar7 != 0xc) {
      pcVar13 = archive_entry_pathname(entry);
      pcVar8 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar13,pcVar8);
      iVar15 = -0x14;
      goto LAB_00190b5c;
    }
    pcVar13 = "Can\'t allocate memory for Pathname";
LAB_00190d6f:
    archive_set_error(&a->archive,0xc,pcVar13);
    iVar5 = -0x1e;
  }
  return iVar5;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	int64_t	ino;
	char h[76];
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	/* Include trailing null. */
	pathlength = (int)len + 1;

	memset(h, 0, sizeof(h));
	format_octal(070707, h + c_magic_offset, c_magic_size);
	format_octal(archive_entry_dev(entry), h + c_dev_offset, c_dev_size);

	ino = synthesize_ino_value(cpio, entry);
	if (ino < 0) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory for ino translation table");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	} else if (ino > 0777777) {
		archive_set_error(&a->archive, ERANGE,
		    "Too many files for this cpio format");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	format_octal(ino & 0777777, h + c_ino_offset, c_ino_size);

	/* TODO: Set ret_final to ARCHIVE_WARN if any of these overflow. */
	format_octal(archive_entry_mode(entry), h + c_mode_offset, c_mode_size);
	format_octal(archive_entry_uid(entry), h + c_uid_offset, c_uid_size);
	format_octal(archive_entry_gid(entry), h + c_gid_offset, c_gid_size);
	format_octal(archive_entry_nlink(entry), h + c_nlink_offset, c_nlink_size);
	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR)
	    format_octal(archive_entry_dev(entry), h + c_rdev_offset, c_rdev_size);
	else
	    format_octal(0, h + c_rdev_offset, c_rdev_size);
	format_octal(archive_entry_mtime(entry), h + c_mtime_offset, c_mtime_size);
	format_octal(pathlength, h + c_namesize_offset, c_namesize_size);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	if (len > 0 && p != NULL  &&  *p != '\0')
		ret = format_octal(strlen(p), h + c_filesize_offset,
		    c_filesize_size);
	else
		ret = format_octal(archive_entry_size(entry),
		    h + c_filesize_offset, c_filesize_size);
	if (ret) {
		archive_set_error(&a->archive, ERANGE,
		    "File is too large for cpio format.");
		ret_final = ARCHIVE_FAILED;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, h, sizeof(h));
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, path, pathlength);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}
exit_write_header:
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret_final);
}